

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

GenFuncs<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* vkt::shaderexecutor::makeVectorizedFuncs<vkt::shaderexecutor::Functions::Degrees>(void)

{
  Degrees *pDVar1;
  GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
  *pGVar2;
  GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
  *pGVar3;
  GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
  *pGVar4;
  GenFuncs<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *in_RDI;
  
  pDVar1 = instance<vkt::shaderexecutor::Functions::Degrees>();
  pGVar2 = &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Degrees,2>>
                      ()->
            super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
  ;
  pGVar3 = &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Degrees,3>>
                      ()->
            super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
  ;
  pGVar4 = &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Degrees,4>>
                      ()->
            super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
  ;
  in_RDI->func = (Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                  *)pDVar1;
  in_RDI->func2 = pGVar2;
  in_RDI->func3 = pGVar3;
  in_RDI->func4 = pGVar4;
  return in_RDI;
}

Assistant:

GenFuncs<typename F::Sig> makeVectorizedFuncs (void)
{
	return GenFuncs<typename F::Sig>(instance<F>(),
									 instance<VectorizedFunc<F, 2> >(),
									 instance<VectorizedFunc<F, 3> >(),
									 instance<VectorizedFunc<F, 4> >());
}